

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkToNetlist(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNetlist.c"
                    ,0x67,"Abc_Ntk_t *Abc_NtkToNetlist(Abc_Ntk_t *)");
    }
  }
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    pNtk_local = Abc_NtkLogicToNetlist(pNtk);
  }
  else {
    pNtk_00 = Abc_NtkAigToLogicSop(pNtk);
    pNtk_local = Abc_NtkLogicToNetlist(pNtk_00);
    Abc_NtkDelete(pNtk_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkToNetlist( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pNtkTemp; 
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkIsStrash(pNtk) )
    {
        pNtkTemp = Abc_NtkAigToLogicSop(pNtk);
        pNtkNew = Abc_NtkLogicToNetlist( pNtkTemp );
        Abc_NtkDelete( pNtkTemp );
        return pNtkNew;
    }
    return Abc_NtkLogicToNetlist( pNtk );
}